

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProblemFireFighting.cpp
# Opt level: O2

void __thiscall ProblemFireFighting::FillTransitionModel(ProblemFireFighting *this)

{
  TransitionModelDiscrete *pTVar1;
  Index IVar2;
  ulong uVar3;
  ulong uVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__x;
  uint uVar5;
  double dVar6;
  vector<unsigned_int,_std::allocator<unsigned_int>_> ja_vec;
  vector<unsigned_int,_std::allocator<unsigned_int>_> s1_vec;
  vector<unsigned_int,_std::allocator<unsigned_int>_> s2_vec;
  vector<unsigned_int,_std::allocator<unsigned_int>_> s1_vec_stripped;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_90;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_88;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_78;
  vector<unsigned_int,std::allocator<unsigned_int>> local_60 [8];
  const_iterator local_58;
  vector<unsigned_int,std::allocator<unsigned_int>> local_48 [24];
  
  uVar5 = 0;
  while( true ) {
    uVar3 = (**(code **)(*(long *)&(this->super_DecPOMDPDiscrete).
                                   super_MultiAgentDecisionProcessDiscrete.
                                   super_MultiAgentDecisionProcess + 0x70))(this);
    if (uVar3 <= uVar5) break;
    uVar3 = 0;
    while( true ) {
      uVar4 = (**(code **)(*(long *)&(this->super_DecPOMDPDiscrete).
                                     super_MultiAgentDecisionProcessDiscrete.
                                     super_MultiAgentDecisionProcess + 0x30))(this);
      if (uVar4 <= uVar3) break;
      IndexTools::JointToIndividualIndices
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_78,(Index)uVar3,
                 &this->_m_nrPerStateFeatureVec);
      for (uVar4 = 0; uVar4 < this->_m_nrJointFirelevels; uVar4 = (ulong)((Index)uVar4 + 1)) {
        IndexTools::JointToIndividualIndices
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60,(Index)uVar4,
                   &this->_m_nrFLs_vec);
        std::vector<unsigned_int,std::allocator<unsigned_int>>::vector<unsigned_int*,void>
                  (local_48,local_78._M_impl.super__Vector_impl_data._M_start,
                   local_78._M_impl.super__Vector_impl_data._M_start +
                   *(long *)&(this->super_DecPOMDPDiscrete).field_0x228,(allocator_type *)&local_90)
        ;
        __x = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
              (**(code **)(*(long *)&(this->super_DecPOMDPDiscrete).
                                     super_MultiAgentDecisionProcessDiscrete.
                                     super_MultiAgentDecisionProcess + 0xa0))(this,uVar5);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_90,__x);
        dVar6 = ComputeTransitionProb
                          (this,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48,
                           (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_90,
                           (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60);
        if (0.0 < dVar6) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          insert<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
                    (local_60,local_58,local_90,local_88);
          IVar2 = IndexTools::IndividualToJointIndices
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60,
                             &this->_m_nrPerStateFeatureVec);
          pTVar1 = (this->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete.
                   _m_p_tModel;
          (*(pTVar1->super_TransitionModelDiscreteInterface).super_TransitionModel.
            _vptr_TransitionModel[5])(dVar6,pTVar1,uVar3,(ulong)uVar5,(ulong)IVar2);
        }
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_90);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_48);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_60);
      }
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_78);
      uVar3 = (ulong)((Index)uVar3 + 1);
    }
    uVar5 = uVar5 + 1;
  }
  return;
}

Assistant:

void ProblemFireFighting::FillTransitionModel()
{
    // add transitions:
    for(Index ja=0; ja<GetNrJointActions(); ja++)
        for(Index s1=0; s1<GetNrStates();s1++) 
        {
#if DEBUG_CTM
            cout << "Transitions from s1="<<s1<<endl;
#endif
            vector< Index > s1_vec = GetStateVector(s1);
/* skip check for matlab generation compatibility            
            size_t nrSPs1 = NumberOfContainedStartPositions(s1_vec);
            if(nrSPs1 > 0 && nrSPs1 != GetNrAgents())
            {
                //illegal state, the prob. is zero except for transition
                //to self:
                SetTransitionProbability(s1, ja, s1, 1.0);
                //else 0, but we do not need to add that
                continue;
            }
*/
            //Since movements are deterministic, we can simply fill out
            //the position elements of the state factor
            //therefore we only need to loop over joint-firelevel vectors 
            //here
            for(Index s2=0; s2<_m_nrJointFirelevels;s2++) 
            {
                vector< Index > s2_vec = IndexTools::JointToIndividualIndices
                    (s2, _m_nrFLs_vec);
                //no longer necessary since we fill in the position components
                //if(NumberOfContainedStartPositions(s2_vec) > 0)
                    //continue;

                vector< Index > s1_vec_stripped(&s1_vec[0], 
                        &s1_vec[_m_nrHouses] );
                vector< Index > ja_vec = JointToIndividualActionIndices(ja);
                double p = ComputeTransitionProb(s1_vec_stripped, 
                        ja_vec, s2_vec);
#if DEBUG_CTM
                cout << "Trans from s="
                    << SoftPrintVector(s1_vec) 
                    << ", a=" 
                    << SoftPrintVector(ja_vec) 
                    << " to s'="
                    << SoftPrintVector(s2_vec) 
                    << " Prob=" << p << endl;
#endif
                if(p > 0.0)
                {
                    //compute full s2 index
                    vector< Index >& full_s2 = s2_vec;
                    full_s2.insert(full_s2.end(), ja_vec.begin(), ja_vec.end());
                    Index fs2I = IndexTools::IndividualToJointIndices(full_s2, 
                            _m_nrPerStateFeatureVec);
                    SetTransitionProbability(s1, ja, fs2I, p);
                }
            }
        }
}